

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_subpixel_8t_intrin_ssse3.c
# Opt level: O0

void filter_vert_w4_ssse3(uint8_t *src,ptrdiff_t src_stride,uint8_t *dst,int16_t *filter)

{
  undefined4 *in_RDX;
  undefined4 extraout_XMM0_Da;
  __m128i temp;
  __m128i s [8];
  ptrdiff_t in_stack_ffffffffffffff18;
  uint8_t local_c8 [40];
  int16_t *in_stack_ffffffffffffff60;
  __m128i *in_stack_ffffffffffffff68;
  
  load_8bit_4x8(local_c8,in_stack_ffffffffffffff18,(__m128i *)0x4c7766);
  filter_vert_kernel(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  *in_RDX = extraout_XMM0_Da;
  return;
}

Assistant:

static void filter_vert_w4_ssse3(const uint8_t *const src,
                                 const ptrdiff_t src_stride, uint8_t *const dst,
                                 const int16_t *const filter) {
  __m128i s[8];
  __m128i temp;

  load_8bit_4x8(src, src_stride, s);
  temp = filter_vert_kernel(s, filter);
  // save only 4 bytes
  *(int *)dst = _mm_cvtsi128_si32(temp);
}